

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_gau(char *fn)

{
  int iVar1;
  uint local_44;
  uint local_40;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_density;
  uint32 *veclen;
  uint32 n_feat;
  uint32 n_mgau;
  vector_t ***mean;
  char *fn_local;
  
  mean = (vector_t ***)fn;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0xa9,"Reading %s\n",fn);
  iVar1 = s3gau_read((char *)mean,(vector_t ****)&n_feat,(uint32 *)((long)&veclen + 4),
                     (uint32 *)&veclen,&j,(uint32 **)&i);
  if (iVar1 == 0) {
    printf("param %u %u %u\n",(ulong)veclen._4_4_,(ulong)(uint)veclen,(ulong)j);
    for (k = 0; k < veclen._4_4_; k = k + 1) {
      printf("mgau %u\n",(ulong)k);
      for (l = 0; l < (uint)veclen; l = l + 1) {
        printf("feat %u\n",(ulong)l);
        for (local_40 = 0; local_40 < j; local_40 = local_40 + 1) {
          printf("density %4u ",(ulong)local_40);
          local_44 = 0;
          while( true ) {
            if (_i[l] <= local_44) break;
            printf(e_fmt,(double)_n_feat[k][l][local_40][local_44]);
            local_44 = local_44 + 1;
          }
          printf("\n");
        }
      }
    }
    ckd_free(_i);
    fn_local._4_4_ = 0;
  }
  else {
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int
print_gau(const char *fn)
{
    vector_t ***mean;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 *veclen;
    uint32 n_density;
    uint32 i, j, k, l;

    E_INFO("Reading %s\n",  fn);
    
    if (s3gau_read(fn,
		   &mean,
		   &n_mgau,
		   &n_feat,
		   &n_density,
		   &veclen) != S3_SUCCESS)
	return S3_ERROR;

    printf("param %u %u %u\n", n_mgau, n_feat, n_density);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feat %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %4u ", k);
		for (l = 0; l < veclen[j]; l++) {
		    printf(e_fmt, mean[i][j][k][l]);
		}
		printf("\n");
	    }
	}
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}